

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

int stb_vorbis_decode_memory(uint8 *mem,int len,int *channels,int *sample_rate,short **output)

{
  int iVar1;
  stb_vorbis *f;
  stb_vorbis *psVar2;
  short *data2;
  int n;
  stb_vorbis *v;
  short *data;
  int local_48;
  int error;
  int limit;
  int total;
  int offset;
  int data_len;
  short **output_local;
  int *sample_rate_local;
  int *channels_local;
  uint8 *puStack_18;
  int len_local;
  uint8 *mem_local;
  
  _offset = output;
  output_local = (short **)sample_rate;
  sample_rate_local = channels;
  channels_local._4_4_ = len;
  puStack_18 = mem;
  f = stb_vorbis_open_memory(mem,len,(int *)((long)&data + 4),(stb_vorbis_alloc *)0x0);
  if (f == (stb_vorbis *)0x0) {
    mem_local._4_4_ = -1;
  }
  else {
    local_48 = f->channels << 0xc;
    *sample_rate_local = f->channels;
    if (output_local != (short **)0x0) {
      *(uint *)output_local = f->sample_rate;
    }
    total = 0;
    limit = 0;
    error = local_48;
    psVar2 = (stb_vorbis *)malloc((long)local_48 << 1);
    if (psVar2 == (stb_vorbis *)0x0) {
      stb_vorbis_close(f);
      mem_local._4_4_ = -2;
    }
    else {
      do {
        do {
          v = psVar2;
          iVar1 = stb_vorbis_get_frame_short_interleaved
                            (f,f->channels,(short *)((long)&v->sample_rate + (long)limit * 2),
                             error - limit);
          if (iVar1 == 0) {
            *_offset = (short *)v;
            stb_vorbis_close(f);
            return total;
          }
          total = iVar1 + total;
          limit = iVar1 * f->channels + limit;
          psVar2 = v;
        } while (limit + local_48 <= error);
        error = error << 1;
        psVar2 = (stb_vorbis *)realloc(v,(long)error << 1);
      } while (psVar2 != (stb_vorbis *)0x0);
      free(v);
      stb_vorbis_close(f);
      mem_local._4_4_ = -2;
    }
  }
  return mem_local._4_4_;
}

Assistant:

int stb_vorbis_decode_memory(const uint8 *mem, int len, int *channels, int *sample_rate, short **output)
{
   int data_len, offset, total, limit, error;
   short *data;
   stb_vorbis *v = stb_vorbis_open_memory(mem, len, &error, NULL);
   if (v == NULL) return -1;
   limit = v->channels * 4096;
   *channels = v->channels;
   if (sample_rate)
      *sample_rate = v->sample_rate;
   offset = data_len = 0;
   total = limit;
   data = (short *) malloc(total * sizeof(*data));
   if (data == NULL) {
      stb_vorbis_close(v);
      return -2;
   }
   for (;;) {
      int n = stb_vorbis_get_frame_short_interleaved(v, v->channels, data+offset, total-offset);
      if (n == 0) break;
      data_len += n;
      offset += n * v->channels;
      if (offset + limit > total) {
         short *data2;
         total *= 2;
         data2 = (short *) realloc(data, total * sizeof(*data));
         if (data2 == NULL) {
            free(data);
            stb_vorbis_close(v);
            return -2;
         }
         data = data2;
      }
   }
   *output = data;
   stb_vorbis_close(v);
   return data_len;
}